

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O0

bool __thiscall draco::ObjEncoder::EncodeFaces(ObjEncoder *this)

{
  bool bVar1;
  ValueType VVar2;
  ObjEncoder *in_RDI;
  int j;
  FaceIndex i;
  ObjEncoder *in_stack_000000d0;
  uint in_stack_ffffffffffffffd8;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> IVar3;
  int in_stack_ffffffffffffffdc;
  FaceIndex in_stack_ffffffffffffffe0;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> in_stack_ffffffffffffffec;
  IndexType<unsigned_int,_draco::FaceIndex_tag_type_> IVar4;
  ObjEncoder *data;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (in_RDI->added_edges_att_ == (PointAttribute *)0x0) {
    data = in_RDI;
    IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::IndexType
              ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)&stack0xffffffffffffffec,0);
    while( true ) {
      VVar2 = Mesh::num_faces((Mesh *)0x124749);
      bVar1 = IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator<
                        ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)
                         &stack0xffffffffffffffec,(uint *)&stack0xffffffffffffffe8);
      if (!bVar1) break;
      IVar3.value_ = in_stack_ffffffffffffffec.value_;
      EncodeFaceAttributes
                ((ObjEncoder *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                 in_stack_ffffffffffffffe0);
      buffer(in_RDI);
      in_stack_ffffffffffffffe0.value_ = CONCAT13(0x66,(int3)in_stack_ffffffffffffffe0.value_);
      EncoderBuffer::Encode<char>
                ((EncoderBuffer *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                 (char *)data);
      for (in_stack_ffffffffffffffdc = 0; in_stack_ffffffffffffffdc < 3;
          in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + 1) {
        IVar4.value_ = IVar3.value_;
        bVar1 = EncodeFaceCorner((ObjEncoder *)CONCAT44(in_stack_ffffffffffffffdc,IVar3.value_),
                                 (FaceIndex)in_stack_ffffffffffffffec.value_,
                                 (int)((ulong)in_RDI >> 0x20));
        if (!bVar1) {
          return false;
        }
        in_stack_ffffffffffffffd8 = IVar3.value_;
        IVar3.value_ = IVar4.value_;
      }
      buffer(in_RDI);
      EncoderBuffer::Encode
                ((EncoderBuffer *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),data
                 ,CONCAT44(IVar3.value_,VVar2));
      IndexType<unsigned_int,_draco::FaceIndex_tag_type_>::operator++
                ((IndexType<unsigned_int,_draco::FaceIndex_tag_type_> *)&stack0xffffffffffffffec);
      in_stack_ffffffffffffffec.value_ = IVar3.value_;
    }
    bVar1 = true;
  }
  else {
    bVar1 = EncodePolygonalFaces(in_stack_000000d0);
  }
  return bVar1;
}

Assistant:

bool ObjEncoder::EncodeFaces() {
  if (added_edges_att_ != nullptr) {
    return EncodePolygonalFaces();
  }
  for (FaceIndex i(0); i < in_mesh_->num_faces(); ++i) {
    EncodeFaceAttributes(i);
    buffer()->Encode('f');
    for (int j = 0; j < 3; ++j) {
      if (!EncodeFaceCorner(i, j)) {
        return false;
      }
    }
    buffer()->Encode("\n", 1);
  }
  return true;
}